

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

property_ptr __thiscall
dtc::fdt::property::parse
          (property *this,text_input_buffer *input,string *key,string_set *label,
          bool semicolonTerminated,define_map *defines)

{
  property *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  property_ptr pVar3;
  shared_ptr<dtc::fdt::property> local_60 [2];
  undefined1 local_39;
  define_map *local_38;
  define_map *defines_local;
  string_set *psStack_28;
  bool semicolonTerminated_local;
  string_set *label_local;
  string *key_local;
  text_input_buffer *input_local;
  property_ptr *p;
  
  local_39 = 0;
  local_38 = defines;
  defines_local._7_1_ = semicolonTerminated;
  psStack_28 = label;
  label_local = (string_set *)key;
  key_local = (string *)input;
  input_local = (text_input_buffer *)this;
  this_00 = (property *)operator_new(0x78);
  property(this_00,(text_input_buffer *)key_local,(string *)label_local,psStack_28,
           (bool)(defines_local._7_1_ & 1),local_38);
  std::shared_ptr<dtc::fdt::property>::shared_ptr<dtc::fdt::property,void>
            ((shared_ptr<dtc::fdt::property> *)this,this_00);
  peVar1 = std::__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  _Var2._M_pi = extraout_RDX;
  if ((peVar1->valid & 1U) == 0) {
    std::shared_ptr<dtc::fdt::property>::shared_ptr(local_60,(nullptr_t)0x0);
    std::shared_ptr<dtc::fdt::property>::operator=((shared_ptr<dtc::fdt::property> *)this,local_60);
    std::shared_ptr<dtc::fdt::property>::~shared_ptr(local_60);
    _Var2._M_pi = extraout_RDX_00;
  }
  pVar3.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar3.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (property_ptr)pVar3.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
property::parse(text_input_buffer &input, string &&key, string_set &&label,
                bool semicolonTerminated, define_map *defines)
{
	property_ptr p(new property(input,
	                            std::move(key),
	                            std::move(label),
	                            semicolonTerminated,
	                            defines));
	if (!p->valid)
	{
		p = nullptr;
	}
	return p;
}